

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

int SaveBinary(path *fname,aint start,aint length)

{
  int iVar1;
  char *badValueMessage;
  int result;
  string local_40;
  FILE *local_20;
  FILE *ff;
  aint length_local;
  aint start_local;
  path *fname_local;
  
  ff._0_4_ = length;
  ff._4_4_ = start;
  _length_local = fname;
  local_20 = (FILE *)SJ_fopen(fname,"wb");
  if (local_20 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_40,_length_local);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",badValueMessage,FATAL);
    std::__cxx11::string::~string((string *)&local_40);
  }
  iVar1 = SaveRAM((FILE *)local_20,ff._4_4_,(aint)ff);
  fclose(local_20);
  return iVar1;
}

Assistant:

int SaveBinary(const std::filesystem::path & fname, aint start, aint length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	int result = SaveRAM(ff, start, length);
	fclose(ff);
	return result;
}